

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O2

void __thiscall
cappuccino::
utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
::do_erase(utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
           *this,size_t element_idx)

{
  long lVar1;
  long lVar2;
  _List_node_base *p_Var3;
  uint in_EAX;
  _List_iterator<unsigned_long> _Var4;
  __off64_t *in_R8;
  size_t in_R9;
  
  lVar2 = *(long *)(this + 0x38);
  lVar1 = lVar2 + element_idx * 0x40;
  _Var4 = std::prev<std::_List_iterator<unsigned_long>>(*(_List_node_base **)(this + 0xb8),1);
  p_Var3 = *(_List_node_base **)(lVar2 + 0x10 + element_idx * 0x40);
  if (p_Var3 != _Var4._M_node) {
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::splice
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x88),
               (int)*(undefined8 *)(this + 0xb8),(__off64_t *)(this + 0x88),(int)p_Var3,in_R8,in_R9,
               in_EAX);
  }
  *(undefined8 *)(this + 0xb8) = *(undefined8 *)(*(long *)(this + 0xb8) + 8);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::erase
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0xa0),
             *(_List_node_base **)(lVar1 + 0x18));
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)(this + 0x50),
          (const_iterator)
          ((_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> *)(lVar1 + 8))
          ->_M_cur);
  *(long *)(this + 0x30) = *(long *)(this + 0x30) + -1;
  return;
}

Assistant:

auto do_erase(size_t element_idx) -> void
    {
        element& e = m_elements[element_idx];

        if (e.m_lru_position != std::prev(m_lru_end))
        {
            m_lru_list.splice(m_lru_end, m_lru_list, e.m_lru_position);
        }
        --m_lru_end;

        m_ttl_list.erase(e.m_ttl_position);

        m_keyed_elements.erase(e.m_keyed_position);

        --m_used_size;
    }